

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

HelicsCore helicsCoreClone(HelicsCore core,HelicsError *err)

{
  CoreObject *pCVar1;
  pointer pCVar2;
  element_type *peVar3;
  void *retcore;
  __single_object coreClone;
  CoreObject *coreObj;
  shared_ptr<helics::Core> *in_stack_ffffffffffffff88;
  HelicsError *in_stack_ffffffffffffff90;
  unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *this;
  HelicsCore in_stack_ffffffffffffff98;
  unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> local_58 [3];
  pointer local_40;
  unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>
  *in_stack_ffffffffffffffc8;
  MasterObjectHolder *in_stack_ffffffffffffffd0;
  pointer local_8;
  
  pCVar1 = helics::getCoreObject(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  if (pCVar1 == (CoreObject *)0x0) {
    local_8 = (pointer)0x0;
  }
  else {
    std::make_unique<helics::CoreObject>();
    pCVar2 = std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::
             operator->((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                        0x19f3f3);
    pCVar2->valid = 0x378424ec;
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::operator->
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)0x19f40e)
    ;
    std::shared_ptr<helics::Core>::operator=
              ((shared_ptr<helics::Core> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_40 = std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::get
                         ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>
                           *)in_stack_ffffffffffffff90);
    getMasterHolder();
    peVar3 = std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x19f440);
    this = local_58;
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::unique_ptr
              (this,(unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                    peVar3);
    MasterObjectHolder::addCore(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr(this)
    ;
    std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x19f47c);
    local_8 = local_40;
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr(this)
    ;
  }
  return local_8;
}

Assistant:

HelicsCore helicsCoreClone(HelicsCore core, HelicsError* err)
{
    auto* coreObj = helics::getCoreObject(core, err);
    if (coreObj == nullptr) {
        return nullptr;
    }
    try {
        auto coreClone = std::make_unique<helics::CoreObject>();
        coreClone->valid = gCoreValidationIdentifier;
        coreClone->coreptr = coreObj->coreptr;
        auto* retcore = reinterpret_cast<HelicsCore>(coreClone.get());
        getMasterHolder()->addCore(std::move(coreClone));

        return retcore;
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}